

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O0

bool __thiscall
dap::Deserializer::deserialize<dap::Thread>(Deserializer *this,array<dap::Thread> *vec)

{
  int iVar1;
  undefined4 extraout_var;
  anon_class_16_2_de36917e local_60;
  function<bool_(dap::Deserializer_*)> local_50;
  size_t local_30;
  size_t i;
  size_t n;
  array<dap::Thread> *vec_local;
  Deserializer *this_local;
  
  n = (size_t)vec;
  vec_local = (array<dap::Thread> *)this;
  iVar1 = (*this->_vptr_Deserializer[8])();
  i = CONCAT44(extraout_var,iVar1);
  std::vector<dap::Thread,_std::allocator<dap::Thread>_>::resize
            ((vector<dap::Thread,_std::allocator<dap::Thread>_> *)n,i);
  local_30 = 0;
  local_60.vec = (array<dap::Thread> **)&n;
  local_60.i = &local_30;
  std::function<bool(dap::Deserializer*)>::
  function<dap::Deserializer::deserialize<dap::Thread>(std::vector<dap::Thread,std::allocator<dap::Thread>>*)const::_lambda(dap::Deserializer*)_1_,void>
            ((function<bool(dap::Deserializer*)> *)&local_50,&local_60);
  iVar1 = (*this->_vptr_Deserializer[9])(this,&local_50);
  std::function<bool_(dap::Deserializer_*)>::~function(&local_50);
  return (((byte)iVar1 ^ 0xff) & 1) == 0;
}

Assistant:

bool Deserializer::deserialize(dap::array<T>* vec) const {
  auto n = count();
  vec->resize(n);
  size_t i = 0;
  if (!array([&](Deserializer* d) { return d->deserialize(&(*vec)[i++]); })) {
    return false;
  }
  return true;
}